

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCommandCommand.cxx
# Opt level: O2

bool __thiscall
cmLoadCommandCommand::InitialPass
          (cmLoadCommandCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  pointer pbVar2;
  bool bVar3;
  char *pcVar4;
  ostream *poVar5;
  LibraryHandle lib;
  SymbolPointer p_Var6;
  cmLoadedCommand *this_00;
  cmState *this_01;
  ulong uVar7;
  allocator local_249;
  string local_248;
  string fullPath;
  string moduleName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path;
  string reportVar;
  string initFuncName;
  
  bVar3 = cmCommand::Disallowed
                    (&this->super_cmCommand,CMP0031,
                     "The load_command command should not be called; see CMP0031.");
  if (bVar3) {
    return true;
  }
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    return true;
  }
  std::__cxx11::string::string
            ((string *)&reportVar,"CMAKE_LOADED_COMMAND_",(allocator *)&initFuncName);
  std::__cxx11::string::append((string *)&reportVar);
  cmMakefile::RemoveDefinition((this->super_cmCommand).Makefile,&reportVar);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string
            ((string *)&initFuncName,"CMAKE_SHARED_MODULE_PREFIX",(allocator *)&fullPath);
  pcVar4 = cmMakefile::GetRequiredDefinition(pcVar1,&initFuncName);
  std::__cxx11::string::string((string *)&moduleName,pcVar4,(allocator *)&local_248);
  std::__cxx11::string::~string((string *)&initFuncName);
  std::operator+(&initFuncName,"cm",
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::append((string *)&moduleName);
  std::__cxx11::string::~string((string *)&initFuncName);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string
            ((string *)&initFuncName,"CMAKE_SHARED_MODULE_SUFFIX",(allocator *)&fullPath);
  cmMakefile::GetRequiredDefinition(pcVar1,&initFuncName);
  std::__cxx11::string::append((char *)&moduleName);
  std::__cxx11::string::~string((string *)&initFuncName);
  path.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  path.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  path.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar7 = 1;
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5);
      uVar7 = (ulong)((int)uVar7 + 1)) {
    std::__cxx11::string::string((string *)&initFuncName,(string *)(pbVar2 + uVar7));
    cmSystemTools::ExpandRegistryValues(&initFuncName,KeyWOW64_Default);
    cmSystemTools::GlobDirs(&initFuncName,&path);
    std::__cxx11::string::~string((string *)&initFuncName);
  }
  std::__cxx11::string::string
            ((string *)&initFuncName,moduleName._M_dataplus._M_p,(allocator *)&local_248);
  cmsys::SystemTools::FindFile(&fullPath,&initFuncName,&path,false);
  std::__cxx11::string::~string((string *)&initFuncName);
  bVar3 = std::operator==(&fullPath,"");
  if (bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&initFuncName);
    poVar5 = std::operator<<((ostream *)&initFuncName,"Attempt to load command failed from file \"")
    ;
    poVar5 = std::operator<<(poVar5,(string *)&moduleName);
    std::operator<<(poVar5,"\"");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&initFuncName);
  }
  else {
    lib = cmDynamicLoader::OpenLibrary(fullPath._M_dataplus._M_p);
    if (lib != (LibraryHandle)0x0) {
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,&reportVar,fullPath._M_dataplus._M_p);
      std::operator+(&initFuncName,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,"Init");
      std::__cxx11::string::string((string *)&local_248,initFuncName._M_dataplus._M_p,&local_249);
      p_Var6 = cmsys::DynamicLoader::GetSymbolAddress(lib,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      if (p_Var6 == (SymbolPointer)0x0) {
        std::__cxx11::string::assign((char *)&initFuncName);
        std::__cxx11::string::append((string *)&initFuncName);
        std::__cxx11::string::append((char *)&initFuncName);
        std::__cxx11::string::string((string *)&local_248,initFuncName._M_dataplus._M_p,&local_249);
        p_Var6 = cmsys::DynamicLoader::GetSymbolAddress(lib,&local_248);
        std::__cxx11::string::~string((string *)&local_248);
        if (p_Var6 != (SymbolPointer)0x0) goto LAB_0037da77;
        std::__cxx11::string::string
                  ((string *)&local_248,"Attempt to load command failed. No init function found.",
                   &local_249);
        cmCommand::SetError(&this->super_cmCommand,&local_248);
        std::__cxx11::string::~string((string *)&local_248);
        bVar3 = false;
      }
      else {
LAB_0037da77:
        this_00 = (cmLoadedCommand *)operator_new(0xb0);
        cmLoadedCommand::cmLoadedCommand(this_00);
        (*p_Var6)(&this_00->info);
        this_01 = cmMakefile::GetState((this->super_cmCommand).Makefile);
        bVar3 = true;
        cmState::AddCommand(this_01,(cmCommand *)this_00);
      }
      std::__cxx11::string::~string((string *)&initFuncName);
      goto LAB_0037db5a;
    }
    std::__cxx11::string::string
              ((string *)&initFuncName,"Attempt to load the library ",(allocator *)&local_248);
    std::operator+(&local_248,&fullPath," failed.");
    std::__cxx11::string::append((string *)&initFuncName);
    std::__cxx11::string::~string((string *)&local_248);
    pcVar4 = cmsys::DynamicLoader::LastError();
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::append((char *)&initFuncName);
      std::__cxx11::string::append((char *)&initFuncName);
    }
    cmCommand::SetError(&this->super_cmCommand,&initFuncName);
    std::__cxx11::string::~string((string *)&initFuncName);
  }
  bVar3 = false;
LAB_0037db5a:
  std::__cxx11::string::~string((string *)&fullPath);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&path);
  std::__cxx11::string::~string((string *)&moduleName);
  std::__cxx11::string::~string((string *)&reportVar);
  return bVar3;
}

Assistant:

bool cmLoadCommandCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(this->Disallowed(cmPolicies::CMP0031,
      "The load_command command should not be called; see CMP0031."))
    { return true; }
  if(args.size() < 1 )
    {
    return true;
    }

  // Construct a variable to report what file was loaded, if any.
  // Start by removing the definition in case of failure.
  std::string reportVar = "CMAKE_LOADED_COMMAND_";
  reportVar += args[0];
  this->Makefile->RemoveDefinition(reportVar);

  // the file must exist
  std::string moduleName =
    this->Makefile->GetRequiredDefinition("CMAKE_SHARED_MODULE_PREFIX");
  moduleName += "cm" + args[0];
  moduleName +=
    this->Makefile->GetRequiredDefinition("CMAKE_SHARED_MODULE_SUFFIX");

  // search for the file
  std::vector<std::string> path;
  for (unsigned int j = 1; j < args.size(); j++)
    {
    // expand variables
    std::string exp = args[j];
    cmSystemTools::ExpandRegistryValues(exp);

    // Glob the entry in case of wildcards.
    cmSystemTools::GlobDirs(exp, path);
    }

  // Try to find the program.
  std::string fullPath = cmSystemTools::FindFile(moduleName.c_str(), path);
  if (fullPath == "")
    {
    std::ostringstream e;
    e << "Attempt to load command failed from file \""
      << moduleName << "\"";
    this->SetError(e.str());
    return false;
    }

  // try loading the shared library / dll
  cmsys::DynamicLoader::LibraryHandle lib
    = cmDynamicLoader::OpenLibrary(fullPath.c_str());
  if(!lib)
    {
    std::string err = "Attempt to load the library ";
    err += fullPath + " failed.";
    const char* error = cmsys::DynamicLoader::LastError();
    if ( error )
      {
      err += " Additional error info is:\n";
      err += error;
      }
    this->SetError(err);
    return false;
    }

  // Report what file was loaded for this command.
  this->Makefile->AddDefinition(reportVar, fullPath.c_str());

  // find the init function
  std::string initFuncName = args[0] + "Init";
  CM_INIT_FUNCTION initFunction
    = (CM_INIT_FUNCTION)
    cmsys::DynamicLoader::GetSymbolAddress(lib, initFuncName.c_str());
  if ( !initFunction )
    {
    initFuncName = "_";
    initFuncName += args[0];
    initFuncName += "Init";
    initFunction = (CM_INIT_FUNCTION)(
      cmsys::DynamicLoader::GetSymbolAddress(lib, initFuncName.c_str()));
    }
  // if the symbol is found call it to set the name on the
  // function blocker
  if(initFunction)
    {
    // create a function blocker and set it up
    cmLoadedCommand *f = new cmLoadedCommand();
    (*initFunction)(&f->info);
    this->Makefile->GetState()->AddCommand(f);
    return true;
    }
  this->SetError("Attempt to load command failed. "
                 "No init function found.");
  return false;
}